

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O1

QSize __thiscall QDockWidgetItem::maximumSize(QDockWidgetItem *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  undefined4 extraout_var_00;
  QDockWidgetLayout *this_00;
  QSize QVar3;
  long *plVar4;
  long in_FS_OFFSET;
  QSize local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (*(this->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])();
  if ((QWidget *)CONCAT44(extraout_var,iVar1) == (QWidget *)0x0) {
    lVar2 = 0;
  }
  else {
    QWidget::layout((QWidget *)CONCAT44(extraout_var,iVar1));
    lVar2 = QMetaObject::cast((QObject *)&QDockWidgetLayout::staticMetaObject);
  }
  if (lVar2 == 0) {
    plVar4 = (long *)0x0;
  }
  else {
    plVar4 = (long *)**(undefined8 **)(lVar2 + 0x28);
  }
  if (plVar4 == (long *)0x0) {
    QVar3.wd.m_i = 0xffffff;
    QVar3.ht.m_i = 0xffffff;
  }
  else {
    iVar1 = (*(this->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])(this);
    if ((QWidget *)CONCAT44(extraout_var_00,iVar1) == (QWidget *)0x0) {
      this_00 = (QDockWidgetLayout *)0x0;
    }
    else {
      QWidget::layout((QWidget *)CONCAT44(extraout_var_00,iVar1));
      this_00 = (QDockWidgetLayout *)
                QMetaObject::cast((QObject *)&QDockWidgetLayout::staticMetaObject);
    }
    local_20 = (QSize)(**(code **)(*plVar4 + 0x20))(plVar4);
    QVar3 = QDockWidgetLayout::sizeFromContent(this_00,&local_20,false);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QSize QDockWidgetItem::maximumSize() const
{
    if (QLayoutItem *item = dockWidgetChildItem()) {
        return dockWidgetLayout()->sizeFromContent(item->maximumSize(), false);
    } else {
        return QSize(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX);
    }
}